

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O0

UBool ucase_addStringCaseClosure_63(UChar *s,int32_t length,USetAdder *sa)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  UChar *t;
  bool bVar4;
  uint local_5c;
  UChar32 c;
  UChar *p;
  uint16_t *unfold;
  int32_t unfoldStringWidth;
  int32_t unfoldRowWidth;
  int32_t unfoldRows;
  int32_t result;
  int32_t limit;
  int32_t start;
  int32_t i;
  USetAdder *sa_local;
  int32_t length_local;
  UChar *s_local;
  
  if ((s != (UChar *)0x0) && (1 < length)) {
    limit = 3;
    if (length < 4) {
      result = 0;
      iVar2 = 0x49;
      while (unfoldRows = iVar2, result < unfoldRows) {
        iVar2 = (result + unfoldRows) / 2;
        t = (UChar *)(ucase_props_unfold + (long)(iVar2 * 5) + 5);
        iVar3 = strcmpMax(s,length,t,3);
        if (iVar3 == 0) {
          while( true ) {
            bVar4 = false;
            if (limit < 5) {
              bVar4 = t[limit] != L'\0';
            }
            if (!bVar4) break;
            local_5c = (uint)(ushort)t[limit];
            iVar1 = limit + 1;
            if ((local_5c & 0xfffffc00) == 0xd800) {
              local_5c = local_5c * 0x400 + (uint)(ushort)t[limit + 1] + 0xfca02400;
              iVar1 = limit + 2;
            }
            limit = iVar1;
            (*(code *)sa->add)(sa->set,local_5c);
            ucase_addCaseClosure_63(local_5c,sa);
          }
          return '\x01';
        }
        if (-1 < iVar3) {
          result = iVar2 + 1;
          iVar2 = unfoldRows;
        }
      }
    }
  }
  return '\0';
}

Assistant:

U_CFUNC UBool U_EXPORT2
ucase_addStringCaseClosure(const UChar *s, int32_t length, const USetAdder *sa) {
    int32_t i, start, limit, result, unfoldRows, unfoldRowWidth, unfoldStringWidth;

    if(ucase_props_singleton.unfold==NULL || s==NULL) {
        return FALSE; /* no reverse case folding data, or no string */
    }
    if(length<=1) {
        /* the string is too short to find any match */
        /*
         * more precise would be:
         * if(!u_strHasMoreChar32Than(s, length, 1))
         * but this does not make much practical difference because
         * a single supplementary code point would just not be found
         */
        return FALSE;
    }

    const uint16_t *unfold=ucase_props_singleton.unfold;
    unfoldRows=unfold[UCASE_UNFOLD_ROWS];
    unfoldRowWidth=unfold[UCASE_UNFOLD_ROW_WIDTH];
    unfoldStringWidth=unfold[UCASE_UNFOLD_STRING_WIDTH];
    unfold+=unfoldRowWidth;

    if(length>unfoldStringWidth) {
        /* the string is too long to find any match */
        return FALSE;
    }

    /* do a binary search for the string */
    start=0;
    limit=unfoldRows;
    while(start<limit) {
        i=(start+limit)/2;
        const UChar *p=reinterpret_cast<const UChar *>(unfold+(i*unfoldRowWidth));
        result=strcmpMax(s, length, p, unfoldStringWidth);

        if(result==0) {
            /* found the string: add each code point, and its case closure */
            UChar32 c;

            for(i=unfoldStringWidth; i<unfoldRowWidth && p[i]!=0;) {
                U16_NEXT_UNSAFE(p, i, c);
                sa->add(sa->set, c);
                ucase_addCaseClosure(c, sa);
            }
            return TRUE;
        } else if(result<0) {
            limit=i;
        } else /* result>0 */ {
            start=i+1;
        }
    }

    return FALSE; /* string not found */
}